

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O2

void __thiscall
slang::ast::ReplicatedAssignmentPatternExpression::visitExprs<netlist::VariableReferenceVisitor&>
          (ReplicatedAssignmentPatternExpression *this,VariableReferenceVisitor *visitor)

{
  Expression::visit<netlist::VariableReferenceVisitor&>(this->count_,visitor);
  AssignmentPatternExpressionBase::visitExprs<netlist::VariableReferenceVisitor&>
            (&this->super_AssignmentPatternExpressionBase,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        count().visit(visitor);
        AssignmentPatternExpressionBase::visitExprs(visitor);
    }